

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O2

bool __thiscall Divide<4,_0,_4>::propagate(Divide<4,_0,_4> *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  anon_union_8_2_743a5d44_for_Reason_0 aVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  IntVar *pIVar11;
  IntVar *pIVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  
  pIVar12 = (this->x).var;
  pIVar11 = (this->y).var;
  lVar6 = (long)(pIVar12->min).v;
  lVar15 = (long)(this->x).b;
  iVar4 = (pIVar12->max).v;
  lVar18 = (long)(pIVar11->min).v;
  lVar17 = (long)(pIVar11->max).v;
  pIVar11 = (this->z).var;
  lVar10 = (long)(this->z).b;
  lVar14 = (pIVar11->min).v + lVar10;
  lVar9 = (pIVar11->max).v + lVar10;
  lVar5 = (lVar17 + lVar6 + lVar15 + -1) / lVar17;
  lVar13 = lVar9;
  if (lVar14 < lVar5) {
    if (so.lazy) {
      iVar2 = (*(pIVar12->super_Var).super_Branching._vptr_Branching[8])(pIVar12);
      uVar3 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[9])();
      aVar7._a = (ulong)uVar3 << 0x20 | (long)iVar2 << 2 | 3;
    }
    else {
      aVar7._pt = (Clause *)0x0;
    }
    bVar1 = IntView<4>::setMin(&this->z,lVar5,(Reason)aVar7,true);
    if (!bVar1) {
      return false;
    }
    pIVar11 = (this->z).var;
    lVar10 = (long)(this->z).b;
    lVar13 = (pIVar11->max).v + lVar10;
  }
  lVar16 = iVar4 + lVar15;
  lVar5 = (lVar18 + lVar16 + -1) / lVar18;
  if (lVar5 < lVar13) {
    if (so.lazy == true) {
      iVar4 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[9])();
      uVar3 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[8])();
      uVar8 = (ulong)uVar3 << 0x20 | (long)iVar4 << 2 | 3;
      lVar10 = (long)(this->z).b;
      pIVar11 = (this->z).var;
    }
    else {
      uVar8 = 0;
    }
    iVar4 = (*(pIVar11->super_Var).super_Branching._vptr_Branching[0xf])
                      (pIVar11,lVar5 - lVar10,uVar8,1);
    if ((char)iVar4 == '\0') {
      return false;
    }
  }
  lVar18 = lVar18 * (lVar14 + -1);
  pIVar12 = (this->x).var;
  lVar13 = (long)(this->x).b;
  if ((pIVar12->min).v + lVar13 <= lVar18) {
    if (so.lazy == true) {
      iVar4 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[8])();
      uVar3 = (*(((this->z).var)->super_Var).super_Branching._vptr_Branching[8])();
      aVar7._a = (ulong)uVar3 << 0x20 | (long)iVar4 << 2 | 3;
    }
    else {
      aVar7._pt = (Clause *)0x0;
    }
    bVar1 = IntView<4>::setMin(&this->x,lVar18 + 1,(Reason)aVar7,true);
    if (!bVar1) {
      return false;
    }
    pIVar12 = (this->x).var;
    lVar13 = (long)(this->x).b;
  }
  if (lVar17 * lVar9 < (pIVar12->max).v + lVar13) {
    if (so.lazy == true) {
      iVar4 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[9])();
      uVar3 = (*(((this->z).var)->super_Var).super_Branching._vptr_Branching[9])();
      uVar8 = (ulong)uVar3 << 0x20 | (long)iVar4 << 2 | 3;
      lVar13 = (long)(this->x).b;
      pIVar12 = (this->x).var;
    }
    else {
      uVar8 = 0;
    }
    iVar4 = (*(pIVar12->super_Var).super_Branching._vptr_Branching[0xf])
                      (pIVar12,lVar17 * lVar9 - lVar13,uVar8,1);
    if ((char)iVar4 == '\0') {
      return false;
    }
  }
  if (0 < lVar9) {
    lVar9 = (lVar6 + lVar15 + -1 + lVar9) / lVar9;
    pIVar12 = (this->y).var;
    if ((pIVar12->min).v < lVar9) {
      if (so.lazy == true) {
        iVar4 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[8])();
        uVar3 = (*(((this->z).var)->super_Var).super_Branching._vptr_Branching[9])();
        uVar8 = (ulong)uVar3 << 0x20 | (long)iVar4 << 2 | 3;
        pIVar12 = (this->y).var;
      }
      else {
        uVar8 = 0;
      }
      iVar4 = (*(pIVar12->super_Var).super_Branching._vptr_Branching[0xe])(pIVar12,lVar9,uVar8,1);
      if ((char)iVar4 == '\0') {
        return false;
      }
    }
  }
  if (lVar14 < 2) {
    return true;
  }
  lVar13 = (lVar14 + lVar16 + -2) / (lVar14 + -1);
  pIVar12 = (this->y).var;
  if (lVar13 <= (pIVar12->max).v) {
    if (so.lazy == true) {
      iVar4 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[9])();
      uVar3 = (*(((this->z).var)->super_Var).super_Branching._vptr_Branching[8])();
      uVar8 = (ulong)uVar3 << 0x20 | (long)iVar4 << 2 | 3;
      pIVar12 = (this->y).var;
    }
    else {
      uVar8 = 0;
    }
    iVar4 = (*(pIVar12->super_Var).super_Branching._vptr_Branching[0xf])
                      (pIVar12,lVar13 + -1,uVar8,1);
    if ((char)iVar4 == '\0') {
      return false;
    }
    return true;
  }
  return true;
}

Assistant:

bool propagate() override {
		const int64_t x_min = x.getMin();
		const int64_t x_max = x.getMax();
		const int64_t y_min = y.getMin();
		const int64_t y_max = y.getMax();
		const int64_t z_min = z.getMin();
		const int64_t z_max = z.getMax();

		// z >= ceil(x.min / y.max)
		setDom(z, setMin, (x_min + y_max - 1) / y_max, x.getMinLit(), y.getMaxLit());
		// z <= ceil(x.max / y.min)
		setDom(z, setMax, (x_max + y_min - 1) / y_min, x.getMaxLit(), y.getMinLit());

		// x >= y.min * (z.min - 1) + 1
		setDom(x, setMin, y_min * (z_min - 1) + 1, y.getMinLit(), z.getMinLit());
		// x <= y.max * z.max
		setDom(x, setMax, y_max * z_max, y.getMaxLit(), z.getMaxLit());

		// y >= ceil(x.min / z.max)
		if (z_max >= 1) {
			setDom(y, setMin, (x_min + z_max - 1) / z_max, x.getMinLit(), z.getMaxLit());
		}

		// y <= ceil(x.max / z.min-1) - 1
		if (z_min >= 2) {
			setDom(y, setMax, (x_max + z_min - 2) / (z_min - 1) - 1, x.getMaxLit(), z.getMinLit());
		}

		return true;
	}